

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  size_t err_code;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  char *dst;
  bool bVar9;
  void *pvVar10;
  char *dst_00;
  size_t err_code_1;
  ulong uVar11;
  ulong uVar12;
  void *pvVar13;
  size_t sStack_90;
  void *local_80;
  long local_68;
  
  if (output->size < output->pos) {
    sStack_90 = 0xffffffffffffffba;
  }
  else {
    uVar11 = input->size;
    uVar7 = input->pos;
    if (uVar11 < uVar7) {
      sStack_90 = 0xffffffffffffffb8;
    }
    else if (endOp < (ZSTD_e_end|ZSTD_e_flush)) {
      sStack_90 = 0xffffffffffffffce;
      if (cctx->streamStage == zcss_init) {
        sVar6 = (uVar11 - uVar7) + cctx->stableIn_notConsumed;
        if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable))
           && (sVar6 < 0x20000)) {
          if (cctx->stableIn_notConsumed != 0) {
            if (input->src != (cctx->expectedInBuffer).src) {
              return 0xffffffffffffffce;
            }
            if (uVar7 != (cctx->expectedInBuffer).size) {
              return 0xffffffffffffffce;
            }
          }
          input->pos = uVar11;
          (cctx->expectedInBuffer).pos = uVar11;
          sVar8 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar8;
          cctx->stableIn_notConsumed = sVar6;
          return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
        }
        sVar6 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar6);
        if (0xffffffffffffff88 < sVar6) {
          return sVar6;
        }
        ZSTD_setBufferExpectations(cctx,output,input);
      }
      ZVar1 = (cctx->appliedParams).inBufferMode;
      if (((ZVar1 != ZSTD_bm_stable) ||
          (((cctx->expectedInBuffer).src == input->src &&
           ((cctx->expectedInBuffer).pos == input->pos)))) &&
         (((cctx->appliedParams).outBufferMode != ZSTD_bm_stable ||
          (cctx->expectedOutBufferSize == output->size - output->pos)))) {
        pvVar3 = input->src;
        if (pvVar3 == (void *)0x0) {
          local_80 = (void *)0x0;
          pvVar13 = (void *)0x0;
        }
        else {
          local_80 = (void *)(input->size + (long)pvVar3);
          pvVar13 = (void *)(input->pos + (long)pvVar3);
        }
        pvVar4 = output->dst;
        if (pvVar4 == (void *)0x0) {
          local_68 = 0;
          dst_00 = (char *)0x0;
        }
        else {
          local_68 = output->size + (long)pvVar4;
          dst_00 = (char *)(output->pos + (long)pvVar4);
        }
        if (ZVar1 == ZSTD_bm_stable) {
          sVar6 = cctx->stableIn_notConsumed;
          input->pos = input->pos - sVar6;
          if (pvVar13 != (void *)0x0) {
            pvVar13 = (void *)((long)pvVar13 - sVar6);
          }
          cctx->stableIn_notConsumed = 0;
        }
        bVar5 = false;
LAB_01bb7373:
        do {
          sStack_90 = 0xffffffffffffffc2;
          if (bVar5) {
            input->pos = (long)pvVar13 - (long)pvVar3;
            output->pos = (long)dst_00 - (long)pvVar4;
            if ((cctx->frameEnded == 0) &&
               (sVar6 = ZSTD_nextInputSizeHint(cctx), 0xffffffffffffff88 < sVar6)) {
              return sVar6;
            }
            ZSTD_setBufferExpectations(cctx,output,input);
            return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
          }
          ZVar2 = cctx->streamStage;
          if (ZVar2 == zcss_load) {
            if (endOp == ZSTD_e_end) {
              sVar6 = ZSTD_compressBound((long)local_80 - (long)pvVar13);
              if (((sVar6 <= (ulong)(local_68 - (long)dst_00)) ||
                  ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)
                 ) {
                sVar6 = ZSTD_compressEnd_public
                                  (cctx,dst_00,local_68 - (long)dst_00,pvVar13,
                                   (long)local_80 - (long)pvVar13);
                if (0xffffffffffffff88 < sVar6) {
                  return sVar6;
                }
                cctx->streamStage = zcss_init;
                cctx->frameEnded = 1;
                cctx->pledgedSrcSizePlusOne = 0;
                dst_00 = dst_00 + sVar6;
                bVar5 = true;
                pvVar13 = local_80;
                goto LAB_01bb7373;
              }
            }
            pvVar10 = pvVar13;
            if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
              sVar6 = cctx->inBuffPos;
              uVar7 = cctx->inBuffTarget - sVar6;
              uVar11 = (long)local_80 - (long)pvVar13;
              if (uVar7 < (ulong)((long)local_80 - (long)pvVar13)) {
                uVar11 = uVar7;
              }
              if (uVar11 != 0) {
                switchD_016b45db::default(cctx->inBuff + sVar6,pvVar13,uVar11);
                sVar6 = cctx->inBuffPos;
              }
              uVar7 = sVar6 + uVar11;
              cctx->inBuffPos = uVar7;
              pvVar10 = (void *)(uVar11 + (long)pvVar13);
              if (pvVar13 == (void *)0x0) {
                pvVar10 = pvVar13;
              }
              pvVar13 = pvVar10;
              if (endOp == ZSTD_e_flush) {
                bVar5 = true;
                if (uVar7 == cctx->inToCompress) goto LAB_01bb7373;
              }
              else if ((endOp == ZSTD_e_continue) && (bVar5 = true, uVar7 < cctx->inBuffTarget))
              goto LAB_01bb7373;
LAB_01bb753e:
              sVar6 = local_68 - (long)dst_00;
              if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_01bb7556;
              uVar11 = cctx->inBuffPos - cctx->inToCompress;
              bVar5 = true;
              pvVar13 = pvVar10;
            }
            else {
              if (endOp == ZSTD_e_flush) {
                bVar5 = true;
                if (pvVar13 == local_80) goto LAB_01bb7373;
              }
              else if (endOp == ZSTD_e_continue) {
                if (cctx->blockSize <= (ulong)((long)local_80 - (long)pvVar13)) goto LAB_01bb753e;
                cctx->stableIn_notConsumed = (long)local_80 - (long)pvVar13;
                bVar5 = true;
                pvVar13 = local_80;
                goto LAB_01bb7373;
              }
              sVar6 = local_68 - (long)dst_00;
LAB_01bb7556:
              uVar11 = (long)local_80 - (long)pvVar10;
              if (cctx->blockSize <= (ulong)((long)local_80 - (long)pvVar10)) {
                uVar11 = cctx->blockSize;
              }
              bVar5 = false;
              pvVar13 = pvVar10;
            }
            sVar8 = ZSTD_compressBound(uVar11);
            dst = dst_00;
            if ((sVar6 < sVar8) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
              sVar6 = cctx->outBuffSize;
              dst = cctx->outBuff;
            }
            if (bVar5) {
              bVar9 = pvVar13 == local_80 && endOp == ZSTD_e_end;
              if (pvVar13 == local_80 && endOp == ZSTD_e_end) {
                uVar11 = ZSTD_compressEnd_public
                                   (cctx,dst,sVar6,cctx->inBuff + cctx->inToCompress,uVar11);
              }
              else {
                uVar11 = ZSTD_compressContinue_public
                                   (cctx,dst,sVar6,cctx->inBuff + cctx->inToCompress,uVar11);
              }
              if (0xffffffffffffff88 < uVar11) {
                return uVar11;
              }
              cctx->frameEnded = (uint)bVar9;
              sVar6 = cctx->inBuffPos;
              uVar7 = cctx->blockSize + sVar6;
              cctx->inBuffTarget = uVar7;
              if (cctx->inBuffSize < uVar7) {
                cctx->inBuffPos = 0;
                cctx->inBuffTarget = cctx->blockSize;
                sVar6 = 0;
              }
              cctx->inToCompress = sVar6;
            }
            else {
              pvVar10 = (void *)((long)pvVar13 + uVar11);
              bVar9 = pvVar10 == local_80 && endOp == ZSTD_e_end;
              if (pvVar10 == local_80 && endOp == ZSTD_e_end) {
                uVar11 = ZSTD_compressEnd_public(cctx,dst,sVar6,pvVar13,uVar11);
              }
              else {
                uVar11 = ZSTD_compressContinue_public(cctx,dst,sVar6,pvVar13,uVar11);
              }
              if (0xffffffffffffff88 < uVar11) {
                return uVar11;
              }
              if (pvVar13 != (void *)0x0) {
                pvVar13 = pvVar10;
              }
              cctx->frameEnded = (uint)bVar9;
            }
            if (dst == dst_00) {
              dst_00 = dst_00 + uVar11;
              bVar5 = false;
              if (bVar9) {
                cctx->streamStage = zcss_init;
                cctx->pledgedSrcSizePlusOne = 0;
                bVar5 = true;
              }
            }
            else {
              cctx->outBuffContentSize = uVar11;
              cctx->outBuffFlushedSize = 0;
              cctx->streamStage = zcss_flush;
              sVar6 = 0;
LAB_01bb76dd:
              uVar11 = uVar11 - sVar6;
              uVar12 = local_68 - (long)dst_00;
              uVar7 = uVar11;
              if (uVar12 < uVar11) {
                uVar7 = uVar12;
              }
              if (uVar7 != 0) {
                switchD_016b45db::default(dst_00,cctx->outBuff + sVar6,uVar7);
                sVar6 = cctx->outBuffFlushedSize;
              }
              dst_00 = dst_00 + uVar7;
              cctx->outBuffFlushedSize = sVar6 + uVar7;
              bVar5 = true;
              if (uVar11 <= uVar12) {
                cctx->outBuffContentSize = 0;
                cctx->outBuffFlushedSize = 0;
                if (cctx->frameEnded == 0) {
                  cctx->streamStage = zcss_load;
                  bVar5 = false;
                }
                else {
                  cctx->streamStage = zcss_init;
                  cctx->pledgedSrcSizePlusOne = 0;
                }
              }
            }
            goto LAB_01bb7373;
          }
          if (ZVar2 == zcss_flush) {
            uVar11 = cctx->outBuffContentSize;
            sVar6 = cctx->outBuffFlushedSize;
            goto LAB_01bb76dd;
          }
          bVar5 = false;
        } while (ZVar2 != zcss_init);
      }
    }
    else {
      sStack_90 = 0xffffffffffffffd6;
    }
  }
  return sStack_90;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}